

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_elements_address.cpp
# Opt level: O0

Address * cfd::ElementsAddressFactory::CreatePegInAddress
                    (NetType mainchain_net_type,AddressType address_type,Script *tweak_fedpegscript)

{
  undefined8 uVar1;
  Script *in_RCX;
  int in_EDX;
  NetType_conflict in_ESI;
  Address *in_RDI;
  Script witness_program;
  Script *in_stack_ffffffffffffff50;
  string *in_stack_ffffffffffffff60;
  Script *__return_storage_ptr__;
  CfdError error_code;
  Address *pAVar2;
  allocator local_81;
  string local_80 [48];
  Script local_50;
  NetType_conflict local_c;
  
  if (in_EDX == 1) {
    core::Address::Address(in_RDI,in_ESI,in_RCX);
    pAVar2 = in_RDI;
  }
  else if (in_EDX == 3) {
    core::Address::Address(in_RDI,in_ESI,kVersion0,in_RCX);
    pAVar2 = in_RDI;
  }
  else {
    if (in_EDX != 5) {
      pAVar2 = in_RDI;
      uVar1 = __cxa_allocate_exception(0x30);
      error_code = (CfdError)((ulong)in_RDI >> 0x20);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_80,"Pubkey-hash cannot be used for the peg-in address type.",&local_81);
      core::CfdException::CfdException((CfdException *)pAVar2,error_code,in_stack_ffffffffffffff60);
      __cxa_throw(uVar1,&core::CfdException::typeinfo,core::CfdException::~CfdException);
    }
    __return_storage_ptr__ = &local_50;
    pAVar2 = in_RDI;
    local_c = in_ESI;
    core::ScriptUtil::CreateP2wshLockingScript(__return_storage_ptr__,in_RCX);
    core::Address::Address(in_RDI,local_c,__return_storage_ptr__);
    core::Script::~Script(in_stack_ffffffffffffff50);
  }
  return pAVar2;
}

Assistant:

Address ElementsAddressFactory::CreatePegInAddress(
    NetType mainchain_net_type, AddressType address_type,
    const Script& tweak_fedpegscript) {
  if (address_type == AddressType::kP2shAddress) {
    return Address(mainchain_net_type, tweak_fedpegscript);
  } else if (address_type == AddressType::kP2wshAddress) {
    return Address(
        mainchain_net_type, WitnessVersion::kVersion0, tweak_fedpegscript);
  } else if (address_type == AddressType::kP2shP2wshAddress) {
    Script witness_program =
        ScriptUtil::CreateP2wshLockingScript(tweak_fedpegscript);
    return Address(mainchain_net_type, witness_program);
  } else {
    throw CfdException(
        CfdError::kCfdIllegalArgumentError,
        "Pubkey-hash cannot be used for the peg-in address type.");
  }
}